

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltools.hh
# Opt level: O0

_anonymous_namespace_ * __thiscall
(anonymous_namespace)::getStringAttribute_abi_cxx11_
          (_anonymous_namespace_ *this,xmlNodePtr type,char *att_name)

{
  xmlChar *pxVar1;
  char *pcVar2;
  MissingAttribute *this_00;
  allocator local_84;
  undefined1 local_83;
  undefined1 local_82;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  char *local_28;
  xmlChar *att;
  char *att_name_local;
  xmlNodePtr type_local;
  string *ret;
  
  att = (xmlChar *)att_name;
  att_name_local = (char *)type;
  type_local = (xmlNodePtr)this;
  pcVar2 = (char *)xmlGetProp(type,att_name);
  local_28 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    local_83 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,pcVar2,&local_84);
    std::allocator<char>::~allocator((allocator<char> *)&local_84);
    (*_xmlFree)(local_28);
    return this;
  }
  local_82 = 1;
  this_00 = (MissingAttribute *)__cxa_allocate_exception(0x80);
  pxVar1 = att;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,(char *)pxVar1,&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  Parsing::MissingAttribute::MissingAttribute(this_00,(string *)local_48,(string *)local_80);
  local_82 = 0;
  __cxa_throw(this_00,&Parsing::MissingAttribute::typeinfo,
              Parsing::MissingAttribute::~MissingAttribute);
}

Assistant:

std::string getStringAttribute(xmlNodePtr type, const char* att_name)
    {
        xmlChar* att = xmlGetProp(type, reinterpret_cast<const xmlChar*>(att_name) );
        if (! att)
            throw Parsing::MissingAttribute(att_name, "");
        std::string ret( reinterpret_cast<const char*>(att));
        xmlFree(att);
        return ret;
    }